

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O3

void FIX::file_mkdir(char *path)

{
  size_t sVar1;
  long lVar2;
  long lVar3;
  string createPath;
  long *local_48 [2];
  long local_38 [2];
  
  sVar1 = strlen(path);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"");
  lVar2 = (long)(int)sVar1;
  if (-1 < lVar2) {
    lVar3 = 0;
    do {
      std::__cxx11::string::push_back((char)local_48);
      if (((path[lVar3] == '/') || (path[lVar3] == '\\')) || (lVar2 == lVar3)) {
        mkdir((char *)local_48[0],0x1ff);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 <= lVar2);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return;
}

Assistant:

void file_mkdir(const char *path) {
  int length = (int)strlen(path);
  std::string createPath = "";

  for (const char *pos = path; (pos - path) <= length; ++pos) {
    createPath += *pos;
    if (*pos == '/' || *pos == '\\' || (pos - path) == length) {
#ifdef _MSC_VER
      _mkdir(createPath.c_str());
#else
      // use umask to override rwx for all
      mkdir(createPath.c_str(), 0777);
#endif
    }
  }
}